

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::Int64Vector::_internal_add_vector(Int64Vector *this,int64_t value)

{
  int64_t local_18;
  int64_t value_local;
  Int64Vector *this_local;
  
  local_18 = value;
  value_local = (int64_t)this;
  google::protobuf::RepeatedField<long>::Add(&this->vector_,&local_18);
  return;
}

Assistant:

inline void Int64Vector::_internal_add_vector(int64_t value) {
  vector_.Add(value);
}